

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::EmitTest::genVertexAttribData(EmitTest *this)

{
  reference pvVar1;
  Vector<float,_4> local_30;
  Vector<float,_4> local_20;
  EmitTest *local_10;
  EmitTest *this_local;
  
  local_10 = this;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_vertexPosData,1);
  tcu::Vector<float,_4>::Vector(&local_20,0.0,0.0,0.0,1.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexPosData,0);
  *(undefined8 *)pvVar1->m_data = local_20.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_20.m_data._8_8_;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,1);
  tcu::Vector<float,_4>::Vector(&local_30,1.0,1.0,1.0,1.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,0);
  *(undefined8 *)pvVar1->m_data = local_30.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_30.m_data._8_8_;
  (this->super_GeometryShaderRenderTest).m_numDrawVertices = 1;
  return;
}

Assistant:

void EmitTest::genVertexAttribData (void)
{
	m_vertexPosData.resize(1);
	m_vertexPosData[0] = tcu::Vec4(0, 0, 0, 1);

	m_vertexAttrData.resize(1);
	m_vertexAttrData[0] = tcu::Vec4(1, 1, 1, 1);

	m_numDrawVertices = 1;
}